

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena_unittest.cc
# Opt level: O2

void __thiscall
google::protobuf::ArenaTest_UnsafeArenaSwap_Test::TestBody(ArenaTest_UnsafeArenaSwap_Test *this)

{
  TestAllTypes *message;
  TestAllTypes *other;
  Arena shared_arena;
  ThreadSafeArena TStack_b8;
  
  internal::ThreadSafeArena::ThreadSafeArena(&TStack_b8);
  message = (TestAllTypes *)
            Arena::DefaultConstruct<proto2_unittest::TestAllTypes>((Arena *)&TStack_b8);
  other = (TestAllTypes *)
          Arena::DefaultConstruct<proto2_unittest::TestAllTypes>((Arena *)&TStack_b8);
  TestUtil::SetAllFields<proto2_unittest::TestAllTypes>(message);
  proto2_unittest::TestAllTypes::UnsafeArenaSwap(message,other);
  TestUtil::ExpectAllFieldsSet<proto2_unittest::TestAllTypes>(other);
  internal::ThreadSafeArena::~ThreadSafeArena(&TStack_b8);
  return;
}

Assistant:

TEST(ArenaTest, UnsafeArenaSwap) {
  Arena shared_arena;
  TestAllTypes* message1 = Arena::Create<TestAllTypes>(&shared_arena);
  TestAllTypes* message2 = Arena::Create<TestAllTypes>(&shared_arena);
  TestUtil::SetAllFields(message1);
  message1->UnsafeArenaSwap(message2);
  TestUtil::ExpectAllFieldsSet(*message2);
}